

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

void igPushStyleColor(ImGuiCol idx,ImVec4 col)

{
  undefined1 auStack_18 [4];
  ImGuiCol idx_local;
  ImVec4 col_local;
  
  col_local._0_8_ = col._8_8_;
  _auStack_18 = col._0_8_;
  ImGui::PushStyleColor(idx,(ImVec4 *)auStack_18);
  return;
}

Assistant:

CIMGUI_API void _igPushStyleColor (ImGuiCol *larg1, ImVec4 const *larg2) {
  ImGuiCol arg1 ;
  ImVec4 arg2 ;
  
  arg1 = *larg1;
  arg2 = *larg2;
  try {
    igPushStyleColor(arg1,arg2);
    
  } catch (...) {
    
  }
}